

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_casx_asi(DisasContext_conflict8 *dc,TCGv_i32 addr,TCGv_i32 cmpv,int insn,int rd)

{
  TCGContext_conflict8 *tcg_ctx_00;
  TCGv_i32 retv;
  TCGv_i32 newv;
  DisasASI DVar1;
  TCGv_i32 oldv;
  DisasASI da;
  TCGContext_conflict8 *tcg_ctx;
  int rd_local;
  int insn_local;
  TCGv_i32 cmpv_local;
  TCGv_i32 addr_local;
  DisasContext_conflict8 *dc_local;
  
  tcg_ctx_00 = dc->uc->tcg_ctx;
  DVar1 = get_asi(dc,insn,MO_BEQ);
  oldv._0_4_ = DVar1.type;
  if ((ASIType)oldv != GET_ASI_EXCP) {
    if ((ASIType)oldv == GET_ASI_DIRECT) {
      retv = tcg_temp_new_i64(tcg_ctx_00);
      newv = gen_load_gpr(dc,rd);
      da.type = DVar1.mem_idx;
      da.asi = DVar1.memop;
      tcg_gen_atomic_cmpxchg_i64_sparc64
                (tcg_ctx_00,(TCGv_i64)retv,(TCGv_i64)addr,(TCGv_i64)cmpv,(TCGv_i64)newv,
                 (long)(int)da.type,da.asi);
      gen_store_gpr(dc,rd,retv);
      tcg_temp_free_i64(tcg_ctx_00,retv);
    }
    else {
      gen_exception(dc,0x32);
    }
  }
  return;
}

Assistant:

static void gen_casx_asi(DisasContext *dc, TCGv addr, TCGv cmpv,
                         int insn, int rd)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    DisasASI da = get_asi(dc, insn, MO_TEQ);
    TCGv oldv;

    switch (da.type) {
    case GET_ASI_EXCP:
        return;
    case GET_ASI_DIRECT:
        oldv = tcg_temp_new(tcg_ctx);
        tcg_gen_atomic_cmpxchg_tl(tcg_ctx, oldv, addr, cmpv, gen_load_gpr(dc, rd),
                                  da.mem_idx, da.memop);
        gen_store_gpr(dc, rd, oldv);
        tcg_temp_free(tcg_ctx, oldv);
        break;
    default:
        /* ??? Should be DAE_invalid_asi.  */
        gen_exception(dc, TT_DATA_ACCESS);
        break;
    }
}